

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O3

void __thiscall pbrt::BlackbodySpectrum::BlackbodySpectrum(BlackbodySpectrum *this,Float T)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float n2;
  
  fVar5 = 0.0;
  this->T = T;
  if (0.0 < T) {
    fVar5 = (0.002897772 / T) * 1e+09 * 1e-09;
    fVar4 = (1.9864457e-25 / (fVar5 * 1.3806487e-23 * T)) * 1.442695;
    auVar2 = vroundss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),9);
    fVar4 = fVar4 - auVar2._0_4_;
    auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar4),ZEXT416(0x3e679a0b)
                            );
    auVar3 = vfmadd213ss_fma(auVar3,ZEXT416((uint)fVar4),ZEXT416(0x3f321004));
    auVar3 = vfmadd213ss_fma(auVar3,ZEXT416((uint)fVar4),ZEXT416(0x3f800000));
    iVar1 = (int)auVar2._0_4_ + -0x7f + (auVar3._0_4_ >> 0x17);
    if (iVar1 < -0x7e) {
      fVar4 = -1.0;
    }
    else if (iVar1 < 0x80) {
      fVar4 = (float)(iVar1 * 0x800000 + 0x3f800000U | auVar3._0_4_ & 0x807fffff) + -1.0;
    }
    else {
      fVar4 = INFINITY;
    }
    fVar5 = 1.1910428e-16 / (fVar5 * fVar5 * fVar5 * fVar5 * fVar5 * fVar4);
    if (NAN(fVar5)) {
      LogFatal<char_const(&)[11]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum.h"
                 ,0x4b,"Check failed: %s",(char (*) [11])"!IsNaN(Le)");
    }
  }
  this->normalizationFactor = 1.0 / fVar5;
  return;
}

Assistant:

PBRT_CPU_GPU
    BlackbodySpectrum(Float T) : T(T) {
        // Compute blackbody normalization constant for given temperature
        Float lambdaMax = 2.8977721e-3f / T;
        normalizationFactor = 1 / Blackbody(lambdaMax * 1e9f, T);
    }